

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall
TiXmlNode::InsertBeforeChild(TiXmlNode *this,TiXmlNode *beforeThis,TiXmlNode *addThis)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TiXmlNode **ppTVar3;
  undefined4 extraout_var_03;
  TiXmlNode *node;
  TiXmlNode *pTVar2;
  
  if ((beforeThis != (TiXmlNode *)0x0) && (beforeThis->parent == this)) {
    pTVar2 = this;
    if (addThis->type == TINYXML_DOCUMENT) {
      while (iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar2),
            CONCAT44(extraout_var_00,iVar1) == 0) {
        ppTVar3 = &pTVar2->parent;
        pTVar2 = *ppTVar3;
        if (*ppTVar3 == (TiXmlNode *)0x0) {
          return (TiXmlNode *)0x0;
        }
      }
      iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar2);
      if (CONCAT44(extraout_var_01,iVar1) != 0) {
        while (iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this),
              CONCAT44(extraout_var_02,iVar1) == 0) {
          this = this->parent;
        }
        iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
        TiXmlDocument::SetError
                  ((TiXmlDocument *)CONCAT44(extraout_var_03,iVar1),0xf,(char *)0x0,
                   (TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
    }
    else {
      iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
      pTVar2 = (TiXmlNode *)CONCAT44(extraout_var,iVar1);
      if (pTVar2 != (TiXmlNode *)0x0) {
        pTVar2->parent = this;
        pTVar2->next = beforeThis;
        pTVar2->prev = beforeThis->prev;
        if (beforeThis->prev == (TiXmlNode *)0x0) {
          if (this->firstChild != beforeThis) {
            __assert_fail("firstChild == beforeThis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                          ,0xff,
                          "TiXmlNode *TiXmlNode::InsertBeforeChild(TiXmlNode *, const TiXmlNode &)")
            ;
          }
          ppTVar3 = &this->firstChild;
        }
        else {
          ppTVar3 = &beforeThis->prev->next;
        }
        *ppTVar3 = pTVar2;
        beforeThis->prev = pTVar2;
        return pTVar2;
      }
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertBeforeChild( TiXmlNode* beforeThis, const TiXmlNode& addThis )
{	
	if ( !beforeThis || beforeThis->parent != this ) {
		return 0;
	}
	if ( addThis.Type() == TiXmlNode::TINYXML_DOCUMENT )
	{
		if ( GetDocument() ) 
			GetDocument()->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if ( !node )
		return 0;
	node->parent = this;

	node->next = beforeThis;
	node->prev = beforeThis->prev;
	if ( beforeThis->prev )
	{
		beforeThis->prev->next = node;
	}
	else
	{
		assert( firstChild == beforeThis );
		firstChild = node;
	}
	beforeThis->prev = node;
	return node;
}